

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-common.c
# Opt level: O0

double msr_get_pl4_limit(raplcap_msr_ctx *ctx,raplcap_zone zone,uint64_t msrval)

{
  double dVar1;
  double watts;
  uint64_t pl_mask;
  uint64_t msrval_local;
  raplcap_msr_ctx *prStack_10;
  raplcap_zone zone_local;
  raplcap_msr_ctx *ctx_local;
  
  pl_mask = msrval;
  msrval_local._4_4_ = zone;
  prStack_10 = ctx;
  if (ctx != (raplcap_msr_ctx *)0x0) {
    watts = 4.04689170508565e-320;
    pl4_limit_quirks(ctx,(uint8_t *)0x0,(uint64_t *)&watts);
    dVar1 = (*prStack_10->cfg[msrval_local._4_4_].from_msr_pl)
                      (pl_mask & (ulong)watts,prStack_10->power_units);
    return dVar1;
  }
  __assert_fail("ctx != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                ,0x2e1,"double msr_get_pl4_limit(const raplcap_msr_ctx *, raplcap_zone, uint64_t)");
}

Assistant:

double msr_get_pl4_limit(const raplcap_msr_ctx* ctx, raplcap_zone zone, uint64_t msrval) {
  assert(ctx != NULL);
  uint64_t pl_mask = PL4_MASK;
  pl4_limit_quirks(ctx, NULL, &pl_mask);
  double watts = ctx->cfg[zone].from_msr_pl((msrval >> PL4_SHIFT) & pl_mask, ctx->power_units);
  raplcap_log(DEBUG, "msr_get_pl4_limit: zone=%d, power=%.12f W\n", zone, watts);
  return watts;
}